

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvtable.cc
# Opt level: O0

Move __thiscall search::PVTable::getMove(PVTable *this,Board *pos)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_unsigned_long,_board::Move>,_false> local_38;
  _Node_iterator_base<std::pair<const_unsigned_long,_board::Move>,_false> local_30;
  const_iterator element;
  uint64_t hash;
  Board *pos_local;
  PVTable *this_local;
  Move move;
  
  element.super__Node_iterator_base<std::pair<const_unsigned_long,_board::Move>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_board::Move>,_false>)
       board::Board::getHashKey(pos);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_board::Move,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_board::Move>_>_>
       ::find(&this->map,(key_type *)&element);
  board::Move::Move((Move *)&this_local);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_board::Move,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_board::Move>_>_>
       ::end(&this->map);
  bVar1 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_long,_board::Move>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_unsigned_long,_board::Move>,_false,_false>
                         *)&local_30);
    this_local = *(PVTable **)&pvVar2->second;
  }
  return (Move)this_local;
}

Assistant:

board::Move search::PVTable::getMove(board::Board& pos) const
{
    uint64_t hash = pos.getHashKey();
    auto element = map.find(hash);
    board::Move move;
    if (element != map.end()) {
        move = element->second;
    }
    return move;
}